

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_operator.cpp
# Opt level: O3

void __thiscall
duckdb::ExpressionExecutor::Execute
          (ExpressionExecutor *this,BoundOperatorExpression *expr,ExpressionState *state,
          SelectionVector *sel,idx_t count,Vector *result)

{
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *this_00;
  ExpressionType EVar1;
  long lVar2;
  uint count_00;
  const_reference pvVar3;
  pointer pEVar4;
  type pEVar5;
  reference pvVar6;
  type state_00;
  reference result_00;
  InvalidInputException *this_01;
  NotImplementedException *pNVar7;
  Vector *pVVar8;
  idx_t iVar9;
  idx_t iVar10;
  idx_t iVar11;
  Vector *sel_00;
  unsigned_long count_01;
  idx_t i;
  size_type sVar12;
  idx_t iVar13;
  Vector *pVVar14;
  idx_t iVar15;
  Vector left;
  Vector intermediate;
  Vector vector_to_check;
  Vector comp_res;
  Value false_val;
  Vector new_result;
  Vector local_338;
  long *local_2b8;
  undefined1 local_2b0 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_298;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_280;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_278;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_268;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_258;
  Vector local_250;
  Vector local_1e8;
  LogicalType local_180;
  Value local_168;
  LogicalType local_128;
  LogicalType local_110;
  LogicalType local_f8;
  Vector local_e0;
  LogicalType local_60;
  LogicalType local_48;
  
  EVar1 = (expr->super_Expression).super_BaseExpression.type;
  if ((byte)(EVar1 - COMPARE_IN) < 2) {
    if (8 < (ulong)((long)(expr->children).
                          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          .
                          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(expr->children).
                         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)) {
      this_00 = &expr->children;
      pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](this_00,0);
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar3);
      LogicalType::LogicalType(&local_f8,&pEVar4->return_type);
      Vector::Vector(&local_338,&local_f8,0x800);
      LogicalType::~LogicalType(&local_f8);
      pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](this_00,0);
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(pvVar3);
      pvVar6 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
               ::operator[](&state->child_states,0);
      Execute(this,pEVar5,
              (pvVar6->
              super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
              )._M_t.
              super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
              .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl,sel,count,
              &local_338);
      LogicalType::LogicalType(&local_180,BOOLEAN);
      Vector::Vector((Vector *)&local_2b8,&local_180,0x800);
      LogicalType::~LogicalType(&local_180);
      Value::BOOLEAN(&local_168,false);
      Vector::Reference((Vector *)&local_2b8,&local_168);
      if (8 < (ulong)((long)(expr->children).
                            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(expr->children).
                           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)) {
        sVar12 = 1;
        do {
          pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   ::operator[](this_00,sVar12);
          pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(pvVar3);
          LogicalType::LogicalType(&local_110,&pEVar4->return_type);
          Vector::Vector(&local_250,&local_110,0x800);
          LogicalType::~LogicalType(&local_110);
          LogicalType::LogicalType(&local_48,BOOLEAN);
          Vector::Vector(&local_1e8,&local_48,0x800);
          LogicalType::~LogicalType(&local_48);
          pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   ::operator[](this_00,sVar12);
          pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator*(pvVar3);
          pvVar6 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
                   ::operator[](&state->child_states,sVar12);
          Execute(this,pEVar5,
                  (pvVar6->
                  super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
                  .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl,sel,count,
                  &local_250);
          VectorOperations::Equals(&local_338,&local_250,&local_1e8,count);
          if (sVar12 == 1) {
            Vector::Reference((Vector *)&local_2b8,&local_1e8);
          }
          else {
            LogicalType::LogicalType(&local_60,BOOLEAN);
            Vector::Vector(&local_e0,&local_60,true,false,0x800);
            LogicalType::~LogicalType(&local_60);
            VectorOperations::Or((Vector *)&local_2b8,&local_1e8,&local_e0,count);
            Vector::Reference((Vector *)&local_2b8,&local_e0);
            if (local_e0.auxiliary.internal.
                super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_e0.auxiliary.internal.
                         super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_e0.buffer.internal.
                super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_e0.buffer.internal.
                         super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                         internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            LogicalType::~LogicalType(&local_e0.type);
          }
          if (local_1e8.auxiliary.internal.
              super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_1e8.auxiliary.internal.
                       super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_1e8.buffer.internal.
              super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_1e8.buffer.internal.
                       super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_1e8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_1e8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          LogicalType::~LogicalType(&local_1e8.type);
          if (local_250.auxiliary.internal.
              super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_250.auxiliary.internal.
                       super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_250.buffer.internal.
              super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_250.buffer.internal.
                       super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_250.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_250.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          LogicalType::~LogicalType(&local_250.type);
          sVar12 = sVar12 + 1;
        } while (sVar12 < (ulong)((long)(expr->children).
                                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                        .
                                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(expr->children).
                                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                        .
                                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      if (EVar1 == COMPARE_NOT_IN) {
        VectorOperations::Not((Vector *)&local_2b8,result,count);
      }
      else {
        Vector::Reference(result,(Vector *)&local_2b8);
      }
      Value::~Value(&local_168);
      if (local_258._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_258._M_pi);
      }
      if (local_268._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_268._M_pi);
      }
      if (local_280._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_280._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)local_2b0);
      if (local_338.auxiliary.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_338.auxiliary.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_338.buffer.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_338.buffer.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_338.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_338.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)((long)&local_338 + 8));
      return;
    }
    this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_338._0_8_ = &local_338.type.type_info_;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_338,"IN needs at least two children","");
    InvalidInputException::InvalidInputException(this_01,(string *)&local_338);
    __cxa_throw(this_01,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (EVar1 == OPERATOR_TRY) {
    pvVar6 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
             ::operator[](&state->child_states,0);
    state_00 = unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>
               ::operator*(pvVar6);
    pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](&expr->children,0);
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(pvVar3);
    Execute(this,pEVar5,state_00,sel,count,result);
    return;
  }
  if (EVar1 != OPERATOR_COALESCE) {
    if ((long)(expr->children).
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(expr->children).
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 8) {
      pNVar7 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_338._0_8_ = &local_338.type.type_info_;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"operator","");
      NotImplementedException::NotImplementedException(pNVar7,(string *)&local_338);
      __cxa_throw(pNVar7,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    DataChunk::Reset(&state->intermediate_chunk);
    result_00 = vector<duckdb::Vector,_true>::operator[](&(state->intermediate_chunk).data,0);
    pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](&expr->children,0);
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(pvVar3);
    pvVar6 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
             ::operator[](&state->child_states,0);
    Execute(this,pEVar5,
            (pvVar6->
            super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
            .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl,sel,count,
            result_00);
    EVar1 = (expr->super_Expression).super_BaseExpression.type;
    if (EVar1 == OPERATOR_IS_NOT_NULL) {
      VectorOperations::IsNotNull(result_00,result,count);
      return;
    }
    if (EVar1 == OPERATOR_IS_NULL) {
      VectorOperations::IsNull(result_00,result,count);
      return;
    }
    if (EVar1 == OPERATOR_NOT) {
      VectorOperations::Not(result_00,result,count);
      return;
    }
    pNVar7 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_338._0_8_ = &local_338.type.type_info_;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_338,"Unsupported operator type with 1 child!","");
    NotImplementedException::NotImplementedException(pNVar7,(string *)&local_338);
    __cxa_throw(pNVar7,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  SelectionVector::SelectionVector((SelectionVector *)&local_250,count);
  SelectionVector::SelectionVector((SelectionVector *)&local_1e8,count);
  SelectionVector::SelectionVector((SelectionVector *)&local_e0,count);
  SelectionVector::SelectionVector((SelectionVector *)&local_168,count);
  if ((expr->children).
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (expr->children).
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    iVar13 = count;
    pVVar8 = (Vector *)sel;
    if (count == 0) goto LAB_0142732b;
  }
  else {
    sVar12 = 0;
    iVar15 = count;
    sel_00 = (Vector *)sel;
    pVVar14 = &local_250;
    do {
      pVVar8 = pVVar14;
      pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](&expr->children,sVar12);
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar3);
      LogicalType::LogicalType(&local_128,&pEVar4->return_type);
      Vector::Vector(&local_338,&local_128,0x800);
      LogicalType::~LogicalType(&local_128);
      pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](&expr->children,sVar12);
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(pvVar3);
      pvVar6 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
               ::operator[](&state->child_states,sVar12);
      Execute(this,pEVar5,
              (pvVar6->
              super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
              )._M_t.
              super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
              .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl,
              (SelectionVector *)sel_00,iVar15,&local_338);
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_2b8);
      Vector::ToUnifiedFormat(&local_338,iVar15,(UnifiedVectorFormat *)&local_2b8);
      if (iVar15 == 0) {
        iVar13 = 0;
      }
      else {
        lVar2 = *local_2b8;
        iVar13 = 0;
        count_01 = 0;
        iVar9 = 0;
        do {
          iVar10 = iVar9;
          if ((sel_00 != (Vector *)0x0) && (*(long *)&sel_00->vector_type != 0)) {
            iVar10 = (idx_t)*(uint *)(*(long *)&sel_00->vector_type + iVar9 * 4);
          }
          iVar11 = iVar9;
          if (lVar2 != 0) {
            iVar11 = (idx_t)*(uint *)(lVar2 + iVar9 * 4);
          }
          if (((element_type *)local_2b0._8_8_ == (element_type *)0x0) ||
             (((ulong)((_func_int ***)local_2b0._8_8_)[iVar11 >> 6] >> (iVar11 & 0x3f) & 1) != 0)) {
            *(int *)(local_e0._0_8_ + count_01 * 4) = (int)iVar9;
            *(sel_t *)(local_168.type_._0_8_ + count_01 * 4) = (sel_t)iVar10;
            count_01 = count_01 + 1;
          }
          else {
            (*(sel_t **)&pVVar8->vector_type)[iVar13] = (sel_t)iVar10;
            iVar13 = iVar13 + 1;
          }
          iVar9 = iVar9 + 1;
        } while (iVar15 != iVar9);
        if (count_01 != 0) {
          Vector::Slice(&local_338,(SelectionVector *)&local_e0,count_01);
          count_00 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(count_01);
          FillSwitch(this,&local_338,result,(SelectionVector *)&local_168,count_00);
        }
      }
      pVVar14 = &local_250;
      if (pVVar8 == &local_250) {
        pVVar14 = &local_1e8;
      }
      if (local_278 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278);
      }
      if (local_298 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_298);
      }
      if (local_338.auxiliary.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_338.auxiliary.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_338.buffer.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_338.buffer.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_338.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_338.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)((long)&local_338 + 8));
      if (iVar13 == 0) goto LAB_0142732b;
      sVar12 = sVar12 + 1;
      iVar15 = iVar13;
      sel_00 = pVVar8;
    } while (sVar12 < (ulong)((long)(expr->children).
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(expr->children).
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  iVar15 = 0;
  do {
    iVar9 = iVar15;
    if (*(sel_t **)&pVVar8->vector_type != (sel_t *)0x0) {
      iVar9 = (idx_t)(*(sel_t **)&pVVar8->vector_type)[iVar15];
    }
    FlatVector::SetNull(result,iVar9,true);
    iVar15 = iVar15 + 1;
  } while (iVar13 != iVar15);
LAB_0142732b:
  if (sel == (SelectionVector *)0x0) {
    if (count == 1) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
    }
  }
  else {
    Vector::Slice(result,sel,count);
  }
  if (local_168.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.type_.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_e0.type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_e0.type.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (local_1e8.type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_1e8.type.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (local_250.type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_250.type.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void ExpressionExecutor::Execute(const BoundOperatorExpression &expr, ExpressionState *state,
                                 const SelectionVector *sel, idx_t count, Vector &result) {
	// special handling for special snowflake 'IN'
	// IN has n children
	auto expression_type = expr.GetExpressionType();
	if (expression_type == ExpressionType::COMPARE_IN || expression_type == ExpressionType::COMPARE_NOT_IN) {
		if (expr.children.size() < 2) {
			throw InvalidInputException("IN needs at least two children");
		}

		Vector left(expr.children[0]->return_type);
		// eval left side
		Execute(*expr.children[0], state->child_states[0].get(), sel, count, left);

		// init result to false
		Vector intermediate(LogicalType::BOOLEAN);
		Value false_val = Value::BOOLEAN(false);
		intermediate.Reference(false_val);

		// in rhs is a list of constants
		// for every child, OR the result of the comparison with the left
		// to get the overall result.
		for (idx_t child = 1; child < expr.children.size(); child++) {
			Vector vector_to_check(expr.children[child]->return_type);
			Vector comp_res(LogicalType::BOOLEAN);

			Execute(*expr.children[child], state->child_states[child].get(), sel, count, vector_to_check);
			VectorOperations::Equals(left, vector_to_check, comp_res, count);

			if (child == 1) {
				// first child: move to result
				intermediate.Reference(comp_res);
			} else {
				// otherwise OR together
				Vector new_result(LogicalType::BOOLEAN, true, false);
				VectorOperations::Or(intermediate, comp_res, new_result, count);
				intermediate.Reference(new_result);
			}
		}
		if (expression_type == ExpressionType::COMPARE_NOT_IN) {
			// NOT IN: invert result
			VectorOperations::Not(intermediate, result, count);
		} else {
			// directly use the result
			result.Reference(intermediate);
		}
	} else if (expression_type == ExpressionType::OPERATOR_COALESCE) {
		SelectionVector sel_a(count);
		SelectionVector sel_b(count);
		SelectionVector slice_sel(count);
		SelectionVector result_sel(count);
		SelectionVector *next_sel = &sel_a;
		const SelectionVector *current_sel = sel;
		idx_t remaining_count = count;
		idx_t next_count;
		for (idx_t child = 0; child < expr.children.size(); child++) {
			Vector vector_to_check(expr.children[child]->return_type);
			Execute(*expr.children[child], state->child_states[child].get(), current_sel, remaining_count,
			        vector_to_check);

			UnifiedVectorFormat vdata;
			vector_to_check.ToUnifiedFormat(remaining_count, vdata);

			idx_t result_count = 0;
			next_count = 0;
			for (idx_t i = 0; i < remaining_count; i++) {
				auto base_idx = current_sel ? current_sel->get_index(i) : i;
				auto idx = vdata.sel->get_index(i);
				if (vdata.validity.RowIsValid(idx)) {
					slice_sel.set_index(result_count, i);
					result_sel.set_index(result_count++, base_idx);
				} else {
					next_sel->set_index(next_count++, base_idx);
				}
			}
			if (result_count > 0) {
				vector_to_check.Slice(slice_sel, result_count);
				FillSwitch(vector_to_check, result, result_sel, NumericCast<sel_t>(result_count));
			}
			current_sel = next_sel;
			next_sel = next_sel == &sel_a ? &sel_b : &sel_a;
			remaining_count = next_count;
			if (next_count == 0) {
				break;
			}
		}
		if (remaining_count > 0) {
			for (idx_t i = 0; i < remaining_count; i++) {
				FlatVector::SetNull(result, current_sel->get_index(i), true);
			}
		}
		if (sel) {
			result.Slice(*sel, count);
		} else if (count == 1) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
		}
	} else if (expression_type == ExpressionType::OPERATOR_TRY) {
		auto &child_state = *state->child_states[0];
		try {
			Execute(*expr.children[0], &child_state, sel, count, result);
			return;
		} catch (std::exception &ex) {
			ErrorData error(ex);
			auto error_type = error.Type();
			if (!Exception::IsExecutionError(error_type)) {
				throw;
			}
		}
		SelectionVector selvec(1);
		DataChunk intermediate;
		intermediate.Initialize(GetAllocator(), {result.GetType()}, 1);
		for (idx_t i = 0; i < count; i++) {
			intermediate.Reset();
			intermediate.SetCardinality(1);
			selvec.set_index(0, sel ? sel->get_index(i) : i);
			Value val(result.GetType());
			try {
				Execute(*expr.children[0], &child_state, &selvec, 1, intermediate.data[0]);
				val = intermediate.GetValue(0, 0);
			} catch (std::exception &ex) {
				ErrorData error(ex);
				auto error_type = error.Type();
				if (!Exception::IsExecutionError(error_type)) {
					throw;
				}
			}
			result.SetValue(i, val);
		}
		if (count == 1) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
		}
	} else if (expr.children.size() == 1) {
		state->intermediate_chunk.Reset();
		auto &child = state->intermediate_chunk.data[0];

		Execute(*expr.children[0], state->child_states[0].get(), sel, count, child);
		switch (expr.GetExpressionType()) {
		case ExpressionType::OPERATOR_NOT: {
			VectorOperations::Not(child, result, count);
			break;
		}
		case ExpressionType::OPERATOR_IS_NULL: {
			VectorOperations::IsNull(child, result, count);
			break;
		}
		case ExpressionType::OPERATOR_IS_NOT_NULL: {
			VectorOperations::IsNotNull(child, result, count);
			break;
		}
		default:
			throw NotImplementedException("Unsupported operator type with 1 child!");
		}
	} else {
		throw NotImplementedException("operator");
	}
}